

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O0

void __thiscall QNativeIpcKey::QNativeIpcKey(QNativeIpcKey *this,QNativeIpcKey *other)

{
  bool bVar1;
  undefined8 *in_RSI;
  QNativeIpcKey *in_RDI;
  QString *in_stack_ffffffffffffffc8;
  QNativeIpcKey *in_stack_ffffffffffffffe0;
  
  in_RDI->d = (QNativeIpcKeyPrivate *)*in_RSI;
  QString::QString(&in_RDI->key,in_stack_ffffffffffffffc8);
  in_RDI->typeAndFlags = *(TypeAndFlags *)(in_RSI + 4);
  bVar1 = isSlowPath(in_RDI);
  if (bVar1) {
    copy_internal(in_stack_ffffffffffffffe0,in_RDI);
  }
  return;
}

Assistant:

QNativeIpcKey(const QNativeIpcKey &other)
        : d(other.d), key(other.key), typeAndFlags(other.typeAndFlags)
    {
        if (isSlowPath())
            copy_internal(other);
    }